

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O1

Gia_Man_t * Gia_ManDupNoMuxes(Gia_Man_t *p,int fSkipBufs)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Gia_Man_t *pGVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  
  if ((p->pMuxes == (uint *)0x0) && (p->nXors == 0)) {
    __assert_fail("p->pMuxes != NULL || Gia_ManXorNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xa6,"Gia_Man_t *Gia_ManDupNoMuxes(Gia_Man_t *, int)");
  }
  p_00 = Gia_ManStart(5000);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  Gia_ManHashStart(p_00);
  if (1 < p->nObjs) {
    lVar15 = 1;
    lVar13 = 0;
    do {
      pGVar3 = p->pObjs;
      uVar4 = *(ulong *)(&pGVar3[1].field_0x0 + lVar13);
      uVar12 = (uint)uVar4;
      if ((uVar12 & 0x9fffffff) == 0x9fffffff) {
        pGVar10 = Gia_ManAppendObj(p_00);
        uVar4 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar4 | 0x9fffffff;
        *(ulong *)pGVar10 =
             uVar4 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar5 = p_00->pObjs;
        if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) {
LAB_0021d9aa:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
        pGVar5 = p_00->pObjs;
        if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_0021d9aa;
        uVar6 = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
      }
      else {
        iVar7 = (int)(uVar4 & 0x1fffffff);
        if ((uVar4 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar12) {
          uVar14 = uVar12 & 0x1fffffff;
          uVar6 = (uint)(uVar4 >> 0x20);
          if ((((int)uVar12 < 0) || (uVar14 == 0x1fffffff)) || (uVar14 != (uVar6 & 0x1fffffff))) {
            if ((p->pMuxes == (uint *)0x0) || (p->pMuxes[lVar15] == 0)) {
              uVar1 = *(uint *)((long)pGVar3 + lVar13 + (ulong)(uint)(iVar7 * 4) * -3 + 0x14);
              if (((int)uVar12 < 0) || ((iVar7 == 0x1fffffff || ((uVar6 & 0x1fffffff) <= uVar14))))
              {
                if (((int)uVar1 < 0) ||
                   (uVar12 = *(uint *)((long)pGVar3 +
                                      lVar13 + (ulong)((uVar6 & 0x1fffffff) << 2) * -3 + 0x14),
                   (int)uVar12 < 0)) goto LAB_0021d9c9;
                uVar6 = Gia_ManHashAnd(p_00,uVar1 ^ (uint)(uVar4 >> 0x1d) & 1,
                                       uVar12 ^ uVar6 >> 0x1d & 1);
              }
              else {
                if (((int)uVar1 < 0) ||
                   (uVar12 = *(uint *)((long)pGVar3 +
                                      lVar13 + (ulong)((uVar6 & 0x1fffffff) << 2) * -3 + 0x14),
                   (int)uVar12 < 0)) goto LAB_0021d9c9;
                uVar6 = Gia_ManHashXor(p_00,uVar1 ^ (uint)(uVar4 >> 0x1d) & 1,
                                       uVar12 ^ uVar6 >> 0x1d & 1);
              }
            }
            else {
              iVar7 = Gia_ObjFanin2Copy(p,(Gia_Obj_t *)(&pGVar3[1].field_0x0 + lVar13));
              uVar4 = *(ulong *)(&pGVar3[1].field_0x0 + lVar13);
              uVar12 = *(uint *)((long)pGVar3 +
                                (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3 + lVar13 + 0x14);
              if ((int)uVar12 < 0) {
LAB_0021d9c9:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x132,"int Abc_LitNotCond(int, int)");
              }
              uVar6 = *(uint *)((long)pGVar3 +
                               lVar13 + (ulong)(((uint)uVar4 & 0x1fffffff) << 2) * -3 + 0x14);
              if ((int)uVar6 < 0) goto LAB_0021d9c9;
              uVar6 = Gia_ManHashMux(p_00,iVar7,(uint)(uVar4 >> 0x3d) & 1 ^ uVar12,
                                     uVar6 ^ (uint)uVar4 >> 0x1d & 1);
            }
          }
          else {
            uVar6 = *(uint *)((long)pGVar3 + lVar13 + (ulong)(uint)(iVar7 << 2) * -3 + 0x14);
            if (fSkipBufs == 0) {
              if ((int)uVar6 < 0) goto LAB_0021d9c9;
              uVar6 = Gia_ManAppendBuf(p_00,uVar6 ^ uVar12 >> 0x1d & 1);
            }
            else {
              if ((int)uVar6 < 0) goto LAB_0021d9c9;
              uVar6 = uVar6 ^ uVar12 >> 0x1d & 1;
            }
          }
        }
        else {
          uVar6 = *(uint *)((long)pGVar3 + lVar13 + (ulong)(uint)(iVar7 << 2) * -3 + 0x14);
          if ((int)uVar6 < 0) goto LAB_0021d9c9;
          uVar6 = Gia_ManAppendCo(p_00,uVar6 ^ uVar12 >> 0x1d & 1);
        }
      }
      *(uint *)((long)&pGVar3[1].Value + lVar13) = uVar6;
      lVar15 = lVar15 + 1;
      lVar13 = lVar13 + 0xc;
    } while (lVar15 < p->nObjs);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_ManDupNoMuxes( Gia_Man_t * p, int fSkipBufs )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pMuxes != NULL || Gia_ManXorNum(p) );
    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashStart( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = fSkipBufs ? Gia_ObjFanin0Copy(pObj) : Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsMuxId(p, i) )
            pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}